

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::ContainerPrinter::
     PrintValue<std::vector<bfy_iovec,std::allocator<bfy_iovec>>,void>
               (vector<bfy_iovec,_std::allocator<bfy_iovec>_> *container,ostream *os)

{
  pointer pbVar1;
  bool bVar2;
  long lVar3;
  bfy_iovec *elem;
  pointer io;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  io = (container->super__Vector_base<bfy_iovec,_std::allocator<bfy_iovec>_>)._M_impl.
       super__Vector_impl_data._M_start;
  pbVar1 = (container->super__Vector_base<bfy_iovec,_std::allocator<bfy_iovec>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (io != pbVar1) {
    lVar3 = 0;
    do {
      if (lVar3 == 0) {
LAB_00131707:
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
        ::operator<<(os,io);
        lVar3 = lVar3 + 1;
        bVar2 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1);
        if (lVar3 != 0x20) goto LAB_00131707;
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        lVar3 = 0x20;
        bVar2 = true;
      }
    } while ((!bVar2) && (io = io + 1, io != pbVar1));
    if (lVar3 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }